

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

uint32_t mpack_expect_ext(mpack_reader_t *reader,int8_t *type)

{
  mpack_tag_t mVar1;
  
  mVar1 = mpack_read_tag(reader);
  if (mVar1.type == mpack_type_ext) {
    *type = mVar1.v._0_1_;
  }
  return mVar1.v._4_4_;
}

Assistant:

uint32_t mpack_expect_ext(mpack_reader_t* reader, int8_t* type) {
    mpack_tag_t var = mpack_read_tag(reader);
    if (var.type == mpack_type_ext)
        *type = var.v.ext.exttype;
        return var.v.ext.length;
    mpack_reader_flag_error(reader, mpack_error_type);
    return 0;
}